

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcatString.cpp
# Opt level: O0

void __thiscall
Js::LiteralStringWithPropertyStringPtr::CachePropertyRecordImpl
          (LiteralStringWithPropertyStringPtr *this,PropertyRecord *propertyRecord)

{
  code *pcVar1;
  bool bVar2;
  charcount_t cVar3;
  charcount_t cVar4;
  undefined4 *puVar5;
  char16 *buffer;
  PropertyRecord *propertyRecord_local;
  LiteralStringWithPropertyStringPtr *this_local;
  
  Memory::WriteBarrierPtr<const_Js::PropertyRecord>::operator=(&this->propertyRecord,propertyRecord)
  ;
  cVar3 = JavascriptString::GetLength((JavascriptString *)this);
  cVar4 = PropertyRecord::GetLength(propertyRecord);
  if (cVar3 != cVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ConcatString.cpp"
                                ,0xbd,"(this->GetLength() == propertyRecord->GetLength())",
                                "this->GetLength() == propertyRecord->GetLength()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  buffer = PropertyRecord::GetBuffer(propertyRecord);
  JavascriptString::SetBuffer((JavascriptString *)this,buffer);
  return;
}

Assistant:

void LiteralStringWithPropertyStringPtr::CachePropertyRecordImpl(_In_ PropertyRecord const* propertyRecord)
    {
        this->propertyRecord = propertyRecord;
        Assert(this->GetLength() == propertyRecord->GetLength());

        // PropertyRecord has its own copy of the string content, so we can drop the reference to our old copy.
        // This is okay because the PropertyRecord pointer will keep the data alive.
        this->SetBuffer(propertyRecord->GetBuffer());
    }